

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O0

BuiltinDecl * jsonnet::internal::jsonnet_builtin_decl(unsigned_long builtin)

{
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_20;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_21;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_22;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_23;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_24;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_25;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_26;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_27;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_28;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_29;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_30;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_31;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_32;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_33;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_34;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_35;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_36;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_37;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_38;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_39;
  ostream *this;
  void *this_00;
  ulong in_RSI;
  BuiltinDecl *in_RDI;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_ffffffffffffe000;
  allocator_type *in_stack_ffffffffffffe028;
  undefined8 **ppuVar1;
  allocator<char32_t> *in_stack_ffffffffffffe030;
  undefined8 **ppuVar2;
  iterator in_stack_ffffffffffffe038;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_ffffffffffffe040;
  undefined1 *puVar3;
  undefined1 **local_1f48;
  undefined1 **local_1ec8;
  undefined1 **local_1e58;
  undefined1 **local_1de8;
  undefined1 **local_1d78;
  undefined1 **local_1d08;
  undefined1 **local_1c88;
  undefined1 **local_1c18;
  undefined1 **local_1ba8;
  undefined1 **local_1b18;
  undefined1 **local_1a98;
  undefined1 **local_1a08;
  undefined1 **local_1978;
  undefined1 **local_18f8;
  undefined1 **local_1888;
  undefined1 **local_1818;
  undefined1 **local_1798;
  undefined1 **local_1728;
  undefined1 **local_16a8;
  undefined1 **local_1638;
  undefined1 **local_15c8;
  undefined1 **local_1558;
  undefined1 **local_14e8;
  undefined1 **local_1478;
  undefined1 **local_1408;
  undefined1 **local_1388;
  undefined1 **local_1318;
  undefined1 **local_1288;
  undefined1 **local_1208;
  undefined1 **local_1198;
  undefined1 **local_1128;
  undefined1 **local_10b8;
  undefined1 **local_1048;
  undefined1 **local_fd8;
  undefined1 **local_f68;
  undefined1 **local_ef8;
  undefined1 **local_e88;
  undefined1 **local_e18;
  undefined1 **local_da8;
  undefined1 **local_d28;
  undefined1 local_cc4;
  undefined1 local_cc3;
  undefined8 *local_cc0;
  undefined1 *local_cb8 [4];
  undefined1 local_c98 [32];
  undefined8 *local_c78;
  undefined8 local_c70;
  undefined1 local_c65;
  undefined1 local_c63;
  undefined8 *local_c60;
  undefined1 *local_c58 [4];
  undefined1 local_c38 [32];
  undefined8 *local_c18;
  undefined8 local_c10;
  undefined1 local_c04;
  undefined1 local_c02;
  undefined8 *local_c00;
  undefined1 *local_bf8 [4];
  undefined8 *local_bd8;
  undefined8 local_bd0;
  undefined1 local_bc4;
  undefined1 local_bc2;
  undefined8 *local_bc0;
  undefined1 *local_bb8 [4];
  undefined8 *local_b98;
  undefined8 local_b90;
  undefined1 local_b84;
  undefined1 local_b82;
  undefined8 *local_b80;
  undefined1 *local_b78 [4];
  undefined8 *local_b58;
  undefined8 local_b50;
  undefined1 local_b44;
  undefined1 local_b42;
  undefined8 *local_b40;
  undefined1 *local_b38 [4];
  undefined8 *local_b18;
  undefined8 local_b10;
  undefined1 local_b05;
  undefined1 local_b03;
  undefined8 *local_b00;
  undefined1 *local_af8 [4];
  undefined1 local_ad8 [32];
  undefined8 *local_ab8;
  undefined8 local_ab0;
  undefined1 local_aa4;
  undefined1 local_aa2;
  undefined8 *local_aa0;
  undefined1 *local_a98 [4];
  undefined8 *local_a78;
  undefined8 local_a70;
  undefined1 local_a64;
  undefined1 local_a62;
  undefined8 *local_a60;
  undefined1 *local_a58 [4];
  undefined8 *local_a38;
  undefined8 local_a30;
  undefined1 local_a26;
  undefined1 local_a24;
  undefined8 *local_a20;
  undefined1 *local_a18 [4];
  undefined1 local_9f8 [32];
  undefined1 local_9d8 [32];
  undefined8 *local_9b8;
  undefined8 local_9b0;
  undefined1 local_9a5;
  undefined1 local_9a3;
  undefined8 *local_9a0;
  undefined1 *local_998 [4];
  undefined1 local_978 [32];
  undefined8 *local_958;
  undefined8 local_950;
  undefined1 local_946;
  undefined1 local_944;
  undefined8 *local_940;
  undefined1 *local_938 [4];
  undefined1 local_918 [32];
  undefined1 local_8f8 [32];
  undefined8 *local_8d8;
  undefined8 local_8d0;
  undefined1 local_8c6;
  undefined1 local_8c4;
  undefined8 *local_8c0;
  undefined1 *local_8b8 [4];
  undefined1 local_898 [32];
  undefined1 local_878 [32];
  undefined8 *local_858;
  undefined8 local_850;
  undefined1 local_845;
  undefined1 local_843;
  undefined8 *local_840;
  undefined1 *local_838 [4];
  undefined1 local_818 [32];
  undefined8 *local_7f8;
  undefined8 local_7f0;
  undefined1 local_7e4;
  undefined1 local_7e2;
  undefined8 *local_7e0;
  undefined1 *local_7d8 [4];
  undefined8 *local_7b8;
  undefined8 local_7b0;
  undefined1 local_7a4;
  undefined1 local_7a2;
  undefined8 *local_7a0;
  undefined1 *local_798 [4];
  undefined8 *local_778;
  undefined8 local_770;
  undefined1 local_765;
  undefined1 local_763;
  undefined8 *local_760;
  undefined1 *local_758 [4];
  undefined1 local_738 [32];
  undefined8 *local_718;
  undefined8 local_710;
  undefined1 local_704;
  undefined1 local_702;
  undefined8 *local_700;
  undefined1 *local_6f8 [4];
  undefined8 *local_6d8;
  undefined8 local_6d0;
  undefined1 local_6c5;
  undefined1 local_6c3;
  undefined8 *local_6c0;
  undefined1 *local_6b8 [4];
  undefined1 local_698 [32];
  undefined8 *local_678;
  undefined8 local_670;
  undefined1 local_664;
  undefined1 local_662;
  undefined8 *local_660;
  undefined1 *local_658 [4];
  undefined8 *local_638;
  undefined8 local_630;
  undefined1 local_624;
  undefined1 local_622;
  undefined8 *local_620;
  undefined1 *local_618 [4];
  undefined8 *local_5f8;
  undefined8 local_5f0;
  undefined1 local_5e4;
  undefined1 local_5e2;
  undefined8 *local_5e0;
  undefined1 *local_5d8 [4];
  undefined8 *local_5b8;
  undefined8 local_5b0;
  undefined1 local_5a4;
  undefined1 local_5a2;
  undefined8 *local_5a0;
  undefined1 *local_598 [4];
  undefined8 *local_578;
  undefined8 local_570;
  undefined1 local_564;
  undefined1 local_562;
  undefined8 *local_560;
  undefined1 *local_558 [4];
  undefined8 *local_538;
  undefined8 local_530;
  undefined1 local_524;
  undefined1 local_522;
  undefined8 *local_520;
  undefined1 *local_518 [4];
  undefined8 *local_4f8;
  undefined8 local_4f0;
  undefined1 local_4e5;
  undefined1 local_4e3;
  undefined8 *local_4e0;
  undefined1 *local_4d8 [4];
  undefined1 local_4b8 [32];
  undefined8 *local_498;
  undefined8 local_490;
  undefined1 local_484;
  undefined1 local_482;
  undefined8 *local_480;
  undefined1 *local_478 [4];
  undefined8 *local_458;
  undefined8 local_450;
  undefined1 local_446;
  undefined1 local_444;
  undefined8 *local_440;
  undefined1 *local_438 [4];
  undefined1 local_418 [32];
  undefined1 local_3f8 [32];
  undefined8 *local_3d8;
  undefined8 local_3d0;
  undefined1 local_3c5;
  undefined1 local_3c3;
  undefined8 *local_3c0;
  undefined1 *local_3b8 [4];
  undefined1 local_398 [32];
  undefined8 *local_378;
  undefined8 local_370;
  undefined1 local_364;
  undefined1 local_362;
  undefined8 *local_360;
  undefined1 *local_358 [4];
  undefined8 *local_338;
  undefined8 local_330;
  undefined1 local_324;
  undefined1 local_322;
  undefined8 *local_320;
  undefined1 *local_318 [4];
  undefined8 *local_2f8;
  undefined8 local_2f0;
  undefined1 local_2e4;
  undefined1 local_2e2;
  undefined8 *local_2e0;
  undefined1 *local_2d8 [4];
  undefined8 *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a4;
  undefined1 local_2a2;
  undefined8 *local_2a0;
  undefined1 *local_298 [4];
  undefined8 *local_278;
  undefined8 local_270;
  undefined1 local_264;
  undefined1 local_262;
  undefined8 *local_260;
  undefined1 *local_258 [4];
  undefined8 *local_238;
  undefined8 local_230;
  undefined1 local_224;
  undefined1 local_222;
  undefined8 *local_220;
  undefined1 *local_218 [4];
  undefined8 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e4;
  undefined1 local_1e2;
  undefined8 *local_1e0;
  undefined1 *local_1d8 [4];
  undefined8 *local_1b8;
  undefined8 local_1b0;
  undefined1 local_1a4;
  undefined1 local_1a2;
  undefined8 *local_1a0;
  undefined1 *local_198 [4];
  undefined8 *local_178;
  undefined8 local_170;
  undefined1 local_164;
  undefined1 local_162;
  undefined8 *local_160;
  undefined1 *local_158 [4];
  undefined8 *local_138;
  undefined8 local_130;
  undefined1 local_124;
  undefined1 local_122;
  undefined8 *local_120;
  undefined1 *local_118 [4];
  undefined8 *local_f8;
  undefined8 local_f0;
  undefined1 local_e5;
  undefined1 local_e3;
  undefined8 *local_e0;
  undefined1 *local_d8 [4];
  undefined1 local_b8 [32];
  undefined8 *local_98;
  undefined8 local_90;
  undefined1 local_85;
  undefined1 local_83;
  undefined8 *local_80;
  undefined1 *local_78 [4];
  undefined1 local_58 [32];
  undefined8 *local_38;
  undefined8 local_30;
  ulong local_10;
  
  switch(in_RSI) {
  case 0:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2985d1);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_85 = 1;
    local_83 = 1;
    local_80 = local_78;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x298640);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_80 = (undefined8 *)local_58;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29868b);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_83 = 0;
    local_38 = local_78;
    local_30 = 2;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x2986e2);
    __l._M_len = (size_type)in_stack_ffffffffffffe040;
    __l._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l,in_stack_ffffffffffffe028);
    local_85 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29871e);
    local_d28 = (undefined1 **)&local_38;
    do {
      local_d28 = local_d28 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_d28 != local_78);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29877d);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29878a);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x298797);
    break;
  case 1:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x298926);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_e5 = 1;
    local_e3 = 1;
    local_e0 = local_d8;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x298995);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_e0 = (undefined8 *)local_b8;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2989e0);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_e3 = 0;
    local_98 = local_d8;
    local_90 = 2;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x298a37);
    __l_00._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_00._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_00,in_stack_ffffffffffffe028);
    local_e5 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x298a73);
    local_da8 = (undefined1 **)&local_98;
    do {
      local_da8 = local_da8 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_da8 != local_d8);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x298ad2);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x298adf);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x298aec);
    break;
  case 2:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x298c7b);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_124 = 1;
    local_122 = 1;
    local_120 = local_118;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x298cea);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_122 = 0;
    local_f8 = local_118;
    local_f0 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x298d41);
    __l_01._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_01._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_01,in_stack_ffffffffffffe028);
    local_124 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x298d7d);
    local_e18 = (undefined1 **)&local_f8;
    do {
      local_e18 = local_e18 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_e18 != local_118);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x298ddc);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x298de9);
    break;
  case 3:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x298f52);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_164 = 1;
    local_162 = 1;
    local_160 = local_158;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x298fc1);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_162 = 0;
    local_138 = local_158;
    local_130 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x299018);
    __l_02._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_02._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_02,in_stack_ffffffffffffe028);
    local_164 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x299054);
    local_e88 = (undefined1 **)&local_138;
    do {
      local_e88 = local_e88 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_e88 != local_158);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x2990b3);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x2990c0);
    break;
  case 4:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x299229);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_1a4 = 1;
    local_1a2 = 1;
    local_1a0 = local_198;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x299298);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_1a2 = 0;
    local_178 = local_198;
    local_170 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x2992ef);
    __l_03._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_03._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_03,in_stack_ffffffffffffe028);
    local_1a4 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29932b);
    local_ef8 = (undefined1 **)&local_178;
    do {
      local_ef8 = local_ef8 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_ef8 != local_198);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29938a);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x299397);
    break;
  case 5:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x299500);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_1e4 = 1;
    local_1e2 = 1;
    local_1e0 = local_1d8;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29956f);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_1e2 = 0;
    local_1b8 = local_1d8;
    local_1b0 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x2995c6);
    __l_04._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_04._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_04,in_stack_ffffffffffffe028);
    local_1e4 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x299602);
    local_f68 = (undefined1 **)&local_1b8;
    do {
      local_f68 = local_f68 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_f68 != local_1d8);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x299661);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29966e);
    break;
  case 6:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2997d7);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_224 = 1;
    local_222 = 1;
    local_220 = local_218;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x299846);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_222 = 0;
    local_1f8 = local_218;
    local_1f0 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29989d);
    __l_05._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_05._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_05,in_stack_ffffffffffffe028);
    local_224 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x2998d9);
    local_fd8 = (undefined1 **)&local_1f8;
    do {
      local_fd8 = local_fd8 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_fd8 != local_218);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x299938);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x299945);
    break;
  case 7:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x299aae);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_264 = 1;
    local_262 = 1;
    local_260 = local_258;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x299b1d);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_262 = 0;
    local_238 = local_258;
    local_230 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x299b74);
    __l_06._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_06._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_06,in_stack_ffffffffffffe028);
    local_264 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x299bb0);
    local_1048 = (undefined1 **)&local_238;
    do {
      local_1048 = local_1048 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1048 != local_258);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x299c0f);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x299c1c);
    break;
  case 8:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x299d85);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_2a4 = 1;
    local_2a2 = 1;
    local_2a0 = local_298;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x299df4);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_2a2 = 0;
    local_278 = local_298;
    local_270 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x299e4b);
    __l_07._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_07._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_07,in_stack_ffffffffffffe028);
    local_2a4 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x299e87);
    local_10b8 = (undefined1 **)&local_278;
    do {
      local_10b8 = local_10b8 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_10b8 != local_298);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x299ee6);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x299ef3);
    break;
  case 9:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29a05c);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_2e4 = 1;
    local_2e2 = 1;
    local_2e0 = local_2d8;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29a0cb);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_2e2 = 0;
    local_2b8 = local_2d8;
    local_2b0 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29a122);
    __l_08._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_08._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_08,in_stack_ffffffffffffe028);
    local_2e4 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29a15e);
    local_1128 = (undefined1 **)&local_2b8;
    do {
      local_1128 = local_1128 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1128 != local_2d8);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29a1bd);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29a1ca);
    break;
  case 10:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29a333);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_324 = 1;
    local_322 = 1;
    local_320 = local_318;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29a3a2);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_322 = 0;
    local_2f8 = local_318;
    local_2f0 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29a3f9);
    __l_09._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_09._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_09,in_stack_ffffffffffffe028);
    local_324 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29a435);
    local_1198 = (undefined1 **)&local_2f8;
    do {
      local_1198 = local_1198 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1198 != local_318);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29a494);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29a4a1);
    break;
  case 0xb:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29a60a);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_364 = 1;
    local_362 = 1;
    local_360 = local_358;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29a679);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_362 = 0;
    local_338 = local_358;
    local_330 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29a6d0);
    __l_10._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_10._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_10,in_stack_ffffffffffffe028);
    local_364 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29a70c);
    local_1208 = (undefined1 **)&local_338;
    do {
      local_1208 = local_1208 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1208 != local_358);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29a76b);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29a778);
    break;
  case 0xc:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29a8e1);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_3c5 = 1;
    local_3c3 = 1;
    local_3c0 = local_3b8;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29a950);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_3c0 = (undefined8 *)local_398;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29a99b);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_3c3 = 0;
    local_378 = local_3b8;
    local_370 = 2;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29a9f2);
    __l_11._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_11._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_11,in_stack_ffffffffffffe028);
    local_3c5 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29aa2e);
    local_1288 = (undefined1 **)&local_378;
    do {
      local_1288 = local_1288 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1288 != local_3b8);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29aa8d);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29aa9a);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29aaa7);
    break;
  case 0xd:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29ac36);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_446 = 1;
    local_444 = 1;
    local_440 = local_438;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29aca5);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_440 = (undefined8 *)local_418;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29acf0);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_440 = (undefined8 *)local_3f8;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29ad3b);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_444 = 0;
    local_3d8 = local_438;
    local_3d0 = 3;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29ad92);
    __l_12._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_12._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_12,in_stack_ffffffffffffe028);
    local_446 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29adce);
    local_1318 = (undefined1 **)&local_3d8;
    do {
      local_1318 = local_1318 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1318 != local_438);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29ae2d);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29ae3a);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29ae47);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29ae54);
    break;
  case 0xe:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29b009);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_484 = 1;
    local_482 = 1;
    local_480 = local_478;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29b078);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_482 = 0;
    local_458 = local_478;
    local_450 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29b0cf);
    __l_13._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_13._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_13,in_stack_ffffffffffffe028);
    local_484 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29b10b);
    local_1388 = (undefined1 **)&local_458;
    do {
      local_1388 = local_1388 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1388 != local_478);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29b16a);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29b177);
    break;
  case 0xf:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29b2e0);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_4e5 = 1;
    local_4e3 = 1;
    local_4e0 = local_4d8;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29b34f);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_4e0 = (undefined8 *)local_4b8;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29b39a);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_4e3 = 0;
    local_498 = local_4d8;
    local_490 = 2;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29b3f1);
    __l_14._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_14._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_14,in_stack_ffffffffffffe028);
    local_4e5 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29b42d);
    local_1408 = (undefined1 **)&local_498;
    do {
      local_1408 = local_1408 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1408 != local_4d8);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29b48c);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29b499);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29b4a6);
    break;
  case 0x10:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29b635);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_524 = 1;
    local_522 = 1;
    local_520 = local_518;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29b6a4);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_522 = 0;
    local_4f8 = local_518;
    local_4f0 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29b6fb);
    __l_15._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_15._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_15,in_stack_ffffffffffffe028);
    local_524 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29b737);
    local_1478 = (undefined1 **)&local_4f8;
    do {
      local_1478 = local_1478 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1478 != local_518);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29b796);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29b7a3);
    break;
  case 0x11:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29b90c);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_564 = 1;
    local_562 = 1;
    local_560 = local_558;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29b97b);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_562 = 0;
    local_538 = local_558;
    local_530 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29b9d2);
    __l_16._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_16._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_16,in_stack_ffffffffffffe028);
    local_564 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29ba0e);
    local_14e8 = (undefined1 **)&local_538;
    do {
      local_14e8 = local_14e8 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_14e8 != local_558);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29ba6d);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29ba7a);
    break;
  case 0x12:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29bbe3);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_5a4 = 1;
    local_5a2 = 1;
    local_5a0 = local_598;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29bc52);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_5a2 = 0;
    local_578 = local_598;
    local_570 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29bca9);
    __l_17._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_17._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_17,in_stack_ffffffffffffe028);
    local_5a4 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29bce5);
    local_1558 = (undefined1 **)&local_578;
    do {
      local_1558 = local_1558 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1558 != local_598);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29bd44);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29bd51);
    break;
  case 0x13:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29beba);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_5e4 = 1;
    local_5e2 = 1;
    local_5e0 = local_5d8;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29bf29);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_5e2 = 0;
    local_5b8 = local_5d8;
    local_5b0 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29bf80);
    __l_18._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_18._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_18,in_stack_ffffffffffffe028);
    local_5e4 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29bfbc);
    local_15c8 = (undefined1 **)&local_5b8;
    do {
      local_15c8 = local_15c8 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_15c8 != local_5d8);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29c01b);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29c028);
    break;
  case 0x14:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29c191);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_624 = 1;
    local_622 = 1;
    local_620 = local_618;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29c200);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_622 = 0;
    local_5f8 = local_618;
    local_5f0 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29c257);
    __l_19._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_19._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_19,in_stack_ffffffffffffe028);
    local_624 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29c293);
    local_1638 = (undefined1 **)&local_5f8;
    do {
      local_1638 = local_1638 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1638 != local_618);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29c2f2);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29c2ff);
    break;
  case 0x15:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29c468);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_664 = 1;
    local_662 = 1;
    local_660 = local_658;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29c4d7);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_662 = 0;
    local_638 = local_658;
    local_630 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29c52e);
    __l_20._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_20._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_20,in_stack_ffffffffffffe028);
    local_664 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29c56a);
    local_16a8 = (undefined1 **)&local_638;
    do {
      local_16a8 = local_16a8 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_16a8 != local_658);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29c5c9);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29c5d6);
    break;
  case 0x16:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29c73f);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_6c5 = 1;
    local_6c3 = 1;
    local_6c0 = local_6b8;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29c7ae);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_6c0 = (undefined8 *)local_698;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29c7f9);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_6c3 = 0;
    local_678 = local_6b8;
    local_670 = 2;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29c850);
    __l_21._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_21._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_21,in_stack_ffffffffffffe028);
    local_6c5 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29c88c);
    local_1728 = (undefined1 **)&local_678;
    do {
      local_1728 = local_1728 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1728 != local_6b8);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29c8eb);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29c8f8);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29c905);
    break;
  case 0x17:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29ca94);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_704 = 1;
    local_702 = 1;
    local_700 = local_6f8;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29cb03);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_702 = 0;
    local_6d8 = local_6f8;
    local_6d0 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29cb5a);
    __l_22._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_22._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_22,in_stack_ffffffffffffe028);
    local_704 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29cb96);
    local_1798 = (undefined1 **)&local_6d8;
    do {
      local_1798 = local_1798 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1798 != local_6f8);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29cbf5);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29cc02);
    break;
  case 0x18:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29cd6b);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_765 = 1;
    local_763 = 1;
    local_760 = local_758;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29cdda);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_760 = (undefined8 *)local_738;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29ce25);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_763 = 0;
    local_718 = local_758;
    local_710 = 2;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29ce7c);
    __l_23._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_23._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_23,in_stack_ffffffffffffe028);
    local_765 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29ceb8);
    local_1818 = (undefined1 **)&local_718;
    do {
      local_1818 = local_1818 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1818 != local_758);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29cf17);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29cf24);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29cf31);
    break;
  case 0x19:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29d0c0);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_7a4 = 1;
    local_7a2 = 1;
    local_7a0 = local_798;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29d12f);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_7a2 = 0;
    local_778 = local_798;
    local_770 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29d186);
    __l_24._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_24._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_24,in_stack_ffffffffffffe028);
    local_7a4 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29d1c2);
    local_1888 = (undefined1 **)&local_778;
    do {
      local_1888 = local_1888 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1888 != local_798);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29d221);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29d22e);
    break;
  case 0x1a:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29d397);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_7e4 = 1;
    local_7e2 = 1;
    local_7e0 = local_7d8;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29d406);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_7e2 = 0;
    local_7b8 = local_7d8;
    local_7b0 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29d45d);
    __l_25._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_25._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_25,in_stack_ffffffffffffe028);
    local_7e4 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29d499);
    local_18f8 = (undefined1 **)&local_7b8;
    do {
      local_18f8 = local_18f8 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_18f8 != local_7d8);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29d4f8);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29d505);
    break;
  case 0x1b:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29d66e);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_845 = 1;
    local_843 = 1;
    local_840 = local_838;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29d6dd);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_840 = (undefined8 *)local_818;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29d728);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_843 = 0;
    local_7f8 = local_838;
    local_7f0 = 2;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29d77f);
    __l_26._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_26._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_26,in_stack_ffffffffffffe028);
    local_845 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29d7bb);
    local_1978 = (undefined1 **)&local_7f8;
    do {
      local_1978 = local_1978 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1978 != local_838);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29d81a);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29d827);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29d834);
    break;
  case 0x1c:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29d9c3);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_8c6 = 1;
    local_8c4 = 1;
    local_8c0 = local_8b8;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29da32);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_8c0 = (undefined8 *)local_898;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29da7d);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_8c0 = (undefined8 *)local_878;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29dac8);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_8c4 = 0;
    local_858 = local_8b8;
    local_850 = 3;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29db1f);
    __l_27._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_27._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_27,in_stack_ffffffffffffe028);
    local_8c6 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29db5b);
    local_1a08 = (undefined1 **)&local_858;
    do {
      local_1a08 = local_1a08 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1a08 != local_8b8);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29dbba);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29dbc7);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29dbd4);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29dbe1);
    break;
  case 0x1d:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29dd96);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_946 = 1;
    local_944 = 1;
    local_940 = local_938;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29de05);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_940 = (undefined8 *)local_918;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29de50);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_940 = (undefined8 *)local_8f8;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29de9b);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_944 = 0;
    local_8d8 = local_938;
    local_8d0 = 3;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29def2);
    __l_28._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_28._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_28,in_stack_ffffffffffffe028);
    local_946 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29df2e);
    local_1a98 = (undefined1 **)&local_8d8;
    do {
      local_1a98 = local_1a98 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1a98 != local_938);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29df8d);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29df9a);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29dfa7);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29dfb4);
    break;
  case 0x1e:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29e169);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_9a5 = 1;
    local_9a3 = 1;
    local_9a0 = local_998;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29e1d8);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_9a0 = (undefined8 *)local_978;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29e223);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_9a3 = 0;
    local_958 = local_998;
    local_950 = 2;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29e27a);
    __l_29._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_29._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_29,in_stack_ffffffffffffe028);
    local_9a5 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29e2b6);
    local_1b18 = (undefined1 **)&local_958;
    do {
      local_1b18 = local_1b18 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1b18 != local_998);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29e315);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29e322);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29e32f);
    break;
  case 0x1f:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29e4be);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_a26 = 1;
    local_a24 = 1;
    local_a20 = local_a18;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29e52d);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_a20 = (undefined8 *)local_9f8;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29e578);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_a20 = (undefined8 *)local_9d8;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29e5c3);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_a24 = 0;
    local_9b8 = local_a18;
    local_9b0 = 3;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29e61a);
    __l_30._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_30._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_30,in_stack_ffffffffffffe028);
    local_a26 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29e656);
    local_1ba8 = (undefined1 **)&local_9b8;
    do {
      local_1ba8 = local_1ba8 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1ba8 != local_a18);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29e6b5);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29e6c2);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29e6cf);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29e6dc);
    break;
  case 0x20:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29e891);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_a64 = 1;
    local_a62 = 1;
    local_a60 = local_a58;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29e900);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_a62 = 0;
    local_a38 = local_a58;
    local_a30 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29e957);
    __l_31._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_31._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_31,in_stack_ffffffffffffe028);
    local_a64 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29e993);
    local_1c18 = (undefined1 **)&local_a38;
    do {
      local_1c18 = local_1c18 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1c18 != local_a58);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29e9f2);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29e9ff);
    break;
  case 0x21:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29eb68);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_aa4 = 1;
    local_aa2 = 1;
    local_aa0 = local_a98;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29ebd7);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_aa2 = 0;
    local_a78 = local_a98;
    local_a70 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29ec2e);
    __l_32._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_32._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_32,in_stack_ffffffffffffe028);
    local_aa4 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29ec6a);
    local_1c88 = (undefined1 **)&local_a78;
    do {
      local_1c88 = local_1c88 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1c88 != local_a98);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29ecc9);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29ecd6);
    break;
  case 0x22:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29ee3f);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_b05 = 1;
    local_b03 = 1;
    local_b00 = local_af8;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29eeae);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_b00 = (undefined8 *)local_ad8;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29eef9);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_b03 = 0;
    local_ab8 = local_af8;
    local_ab0 = 2;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29ef50);
    __l_33._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_33._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_33,in_stack_ffffffffffffe028);
    local_b05 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29ef8c);
    local_1d08 = (undefined1 **)&local_ab8;
    do {
      local_1d08 = local_1d08 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1d08 != local_af8);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29efeb);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29eff8);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29f005);
    break;
  case 0x23:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29f194);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_b44 = 1;
    local_b42 = 1;
    local_b40 = local_b38;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29f203);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_b42 = 0;
    local_b18 = local_b38;
    local_b10 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29f25a);
    __l_34._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_34._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_34,in_stack_ffffffffffffe028);
    local_b44 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29f296);
    local_1d78 = (undefined1 **)&local_b18;
    do {
      local_1d78 = local_1d78 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1d78 != local_b38);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29f2f5);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29f302);
    break;
  case 0x24:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29f46b);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_b84 = 1;
    local_b82 = 1;
    local_b80 = local_b78;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29f4da);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_b82 = 0;
    local_b58 = local_b78;
    local_b50 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29f531);
    __l_35._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_35._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_35,in_stack_ffffffffffffe028);
    local_b84 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29f56d);
    local_1de8 = (undefined1 **)&local_b58;
    do {
      local_1de8 = local_1de8 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1de8 != local_b78);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29f5cc);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29f5d9);
    break;
  case 0x25:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29f742);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_bc4 = 1;
    local_bc2 = 1;
    local_bc0 = local_bb8;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29f7b1);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_bc2 = 0;
    local_b98 = local_bb8;
    local_b90 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29f808);
    __l_36._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_36._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_36,in_stack_ffffffffffffe028);
    local_bc4 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29f844);
    local_1e58 = (undefined1 **)&local_b98;
    do {
      local_1e58 = local_1e58 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1e58 != local_bb8);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29f8a3);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29f8b0);
    break;
  case 0x26:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29fa19);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_c04 = 1;
    local_c02 = 1;
    local_c00 = local_bf8;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29fa88);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_c02 = 0;
    local_bd8 = local_bf8;
    local_bd0 = 1;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29fadf);
    __l_37._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_37._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_37,in_stack_ffffffffffffe028);
    local_c04 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29fb1b);
    local_1ec8 = (undefined1 **)&local_bd8;
    do {
      local_1ec8 = local_1ec8 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1ec8 != local_bf8);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29fb7a);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29fb87);
    break;
  case 0x27:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29fcf0);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_c65 = 1;
    local_c63 = 1;
    local_c60 = local_c58;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29fd5f);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_c60 = (undefined8 *)local_c38;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x29fdaa);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_c63 = 0;
    local_c18 = local_c58;
    local_c10 = 2;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x29fe01);
    __l_38._M_len = (size_type)in_stack_ffffffffffffe040;
    __l_38._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_38,in_stack_ffffffffffffe028);
    local_c65 = 0;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x29fe3d);
    local_1f48 = (undefined1 **)&local_c18;
    do {
      local_1f48 = local_1f48 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (local_1f48 != local_c58);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29fe9c);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29fea9);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x29feb6);
    break;
  case 0x28:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2a0042);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_cc3 = 1;
    local_cc0 = local_cb8;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2a00a8);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_cc0 = (undefined8 *)local_c98;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2a00e7);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_ffffffffffffe040,(char32_t *)in_stack_ffffffffffffe038,
               in_stack_ffffffffffffe030);
    local_cc3 = 0;
    local_c78 = local_cb8;
    local_c70 = 2;
    puVar3 = &local_cc4;
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 *)0x2a0135);
    __l_39._M_len = (size_type)puVar3;
    __l_39._M_array = in_stack_ffffffffffffe038;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)in_stack_ffffffffffffe030,__l_39,in_stack_ffffffffffffe028);
    std::
    allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                  *)0x2a016b);
    ppuVar2 = (undefined8 **)local_cb8;
    ppuVar1 = &local_c78;
    do {
      ppuVar1 = ppuVar1 + -4;
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffe000);
    } while (ppuVar1 != ppuVar2);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x2a01b5);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x2a01c2);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x2a01cf);
    break;
  default:
    local_10 = in_RSI;
    this = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unrecognized builtin function: ");
    this_00 = (void *)std::ostream::operator<<(this,local_10);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    abort();
  }
  return in_RDI;
}

Assistant:

BuiltinDecl jsonnet_builtin_decl(unsigned long builtin)
{
    switch (builtin) {
        case 0: return {U"makeArray", {U"sz", U"func"}};
        case 1: return {U"pow", {U"x", U"n"}};
        case 2: return {U"floor", {U"x"}};
        case 3: return {U"ceil", {U"x"}};
        case 4: return {U"sqrt", {U"x"}};
        case 5: return {U"sin", {U"x"}};
        case 6: return {U"cos", {U"x"}};
        case 7: return {U"tan", {U"x"}};
        case 8: return {U"asin", {U"x"}};
        case 9: return {U"acos", {U"x"}};
        case 10: return {U"atan", {U"x"}};
        case 11: return {U"type", {U"x"}};
        case 12: return {U"filter", {U"func", U"arr"}};
        case 13: return {U"objectHasEx", {U"obj", U"f", U"inc_hidden"}};
        case 14: return {U"length", {U"x"}};
        case 15: return {U"objectFieldsEx", {U"obj", U"inc_hidden"}};
        case 16: return {U"codepoint", {U"str"}};
        case 17: return {U"char", {U"n"}};
        case 18: return {U"log", {U"n"}};
        case 19: return {U"exp", {U"n"}};
        case 20: return {U"mantissa", {U"n"}};
        case 21: return {U"exponent", {U"n"}};
        case 22: return {U"modulo", {U"a", U"b"}};
        case 23: return {U"extVar", {U"x"}};
        case 24: return {U"primitiveEquals", {U"a", U"b"}};
        case 25: return {U"native", {U"name"}};
        case 26: return {U"md5", {U"str"}};
        case 27: return {U"trace", {U"str", U"rest"}};
        case 28: return {U"splitLimit", {U"str", U"c", U"maxsplits"}};
        case 29: return {U"substr", {U"str", U"from", U"len"}};
        case 30: return {U"range", {U"from", U"to"}};
        case 31: return {U"strReplace", {U"str", U"from", U"to"}};
        case 32: return {U"asciiLower", {U"str"}};
        case 33: return {U"asciiUpper", {U"str"}};
        case 34: return {U"join", {U"sep", U"arr"}};
        case 35: return {U"parseJson", {U"str"}};
        case 36: return {U"parseYaml", {U"str"}};
        case 37: return {U"encodeUTF8", {U"str"}};
        case 38: return {U"decodeUTF8", {U"arr"}};
        case 39: return {U"atan2", {U"y", U"x"}};
        case 40: return {U"hypot", {U"a", U"b"}};
        default:
            std::cerr << "INTERNAL ERROR: Unrecognized builtin function: " << builtin << std::endl;
            std::abort();
    }
    // Quiet, compiler.
    return BuiltinDecl();
}